

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_interface.cpp
# Opt level: O1

XrGeneratedDispatchTableCore * RuntimeInterface::GetDispatchTable(XrInstance instance)

{
  RuntimeInterface *pRVar1;
  ulong uVar2;
  long *plVar3;
  int iVar4;
  unique_ptr<RuntimeInterface,_std::default_delete<RuntimeInterface>_> *puVar5;
  ulong uVar6;
  mutex *__mutex;
  long *plVar7;
  long *plVar8;
  long lVar9;
  XrGeneratedDispatchTableCore *pXVar10;
  
  puVar5 = GetInstance();
  __mutex = &((puVar5->_M_t).
              super___uniq_ptr_impl<RuntimeInterface,_std::default_delete<RuntimeInterface>_>._M_t.
              super__Tuple_impl<0UL,_RuntimeInterface_*,_std::default_delete<RuntimeInterface>_>.
              super__Head_base<0UL,_RuntimeInterface_*,_false>._M_head_impl)->_dispatch_table_mutex;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  puVar5 = GetInstance();
  pRVar1 = (puVar5->_M_t).
           super___uniq_ptr_impl<RuntimeInterface,_std::default_delete<RuntimeInterface>_>._M_t.
           super__Tuple_impl<0UL,_RuntimeInterface_*,_std::default_delete<RuntimeInterface>_>.
           super__Head_base<0UL,_RuntimeInterface_*,_false>._M_head_impl;
  uVar2 = *(size_type *)((long)&(pRVar1->_dispatch_table_map)._M_h + 8);
  uVar6 = (ulong)instance % uVar2;
  plVar7 = *(long **)((long)(pRVar1->_dispatch_table_map)._M_h._M_buckets + uVar6 * 8);
  plVar8 = (long *)0x0;
  if ((plVar7 != (long *)0x0) &&
     (plVar3 = (long *)*plVar7, plVar8 = plVar7, (XrInstance)((long *)*plVar7)[1] != instance)) {
    while (plVar7 = plVar3, plVar3 = (long *)*plVar7, plVar3 != (long *)0x0) {
      plVar8 = (long *)0x0;
      if (((ulong)plVar3[1] % uVar2 != uVar6) ||
         (plVar8 = plVar7, (XrInstance)plVar3[1] == instance)) goto LAB_0011b427;
    }
    plVar8 = (long *)0x0;
  }
LAB_0011b427:
  if (plVar8 == (long *)0x0) {
    lVar9 = 0;
  }
  else {
    lVar9 = *plVar8;
  }
  GetInstance();
  if (lVar9 == 0) {
    pXVar10 = (XrGeneratedDispatchTableCore *)0x0;
  }
  else {
    pXVar10 = *(XrGeneratedDispatchTableCore **)(lVar9 + 0x10);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return pXVar10;
}

Assistant:

const XrGeneratedDispatchTableCore* RuntimeInterface::GetDispatchTable(XrInstance instance) {
    XrGeneratedDispatchTableCore* table = nullptr;
    std::lock_guard<std::mutex> mlock(GetInstance()->_dispatch_table_mutex);
    auto it = GetInstance()->_dispatch_table_map.find(instance);
    if (it != GetInstance()->_dispatch_table_map.end()) {
        table = it->second.get();
    }
    return table;
}